

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::Seek(Iter *this,Slice *target)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  char *key_ptr;
  uint32_t region_offset;
  uint32_t mid;
  uint32_t right;
  uint32_t left;
  Slice mid_key;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  string *in_stack_ffffffffffffffa0;
  uint32_t index;
  uint32_t in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint uVar6;
  Slice *p;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *(int *)((long)&in_RDI[3].size_ + 4) - 1;
  uVar2 = 0;
  p = in_RDI;
  while (uVar6 = uVar2, index = (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20), uVar6 < uVar4)
  {
    in_stack_ffffffffffffffac = uVar6 + uVar4 + 1 >> 1;
    in_stack_ffffffffffffffa8 =
         GetRestartPoint((Iter *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),index
                        );
    in_stack_ffffffffffffffa0 =
         (string *)
         DecodeEntry((char *)p,in_RSI,(uint32_t *)CONCAT44(uVar6,uVar4),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (uint32_t *)in_stack_ffffffffffffffa0);
    if ((in_stack_ffffffffffffffa0 == (string *)0x0) || (local_c != 0)) {
      CorruptionError((Iter *)CONCAT44(uVar6,uVar4));
      goto LAB_00d6015d;
    }
    Slice::Slice((Slice *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)in_stack_ffffffffffffffa0,(size_t)in_RDI);
    iVar5 = Compare((Iter *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (Slice *)in_stack_ffffffffffffffa0,in_RDI);
    uVar2 = in_stack_ffffffffffffffac;
    if (-1 < iVar5) {
      uVar4 = in_stack_ffffffffffffffac - 1;
      uVar2 = uVar6;
    }
  }
  SeekToRestartPoint((Iter *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),index);
  do {
    bVar3 = ParseNextKey((Iter *)CONCAT44(uVar6,uVar4));
    if (!bVar3) break;
    Slice::Slice((Slice *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa0);
    iVar5 = Compare((Iter *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (Slice *)in_stack_ffffffffffffffa0,in_RDI);
  } while (iVar5 < 0);
LAB_00d6015d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Seek(const Slice& target) override {
    // Binary search in restart array to find the last restart point
    // with a key < target
    uint32_t left = 0;
    uint32_t right = num_restarts_ - 1;
    while (left < right) {
      uint32_t mid = (left + right + 1) / 2;
      uint32_t region_offset = GetRestartPoint(mid);
      uint32_t shared, non_shared, value_length;
      const char* key_ptr =
          DecodeEntry(data_ + region_offset, data_ + restarts_, &shared,
                      &non_shared, &value_length);
      if (key_ptr == nullptr || (shared != 0)) {
        CorruptionError();
        return;
      }
      Slice mid_key(key_ptr, non_shared);
      if (Compare(mid_key, target) < 0) {
        // Key at "mid" is smaller than "target".  Therefore all
        // blocks before "mid" are uninteresting.
        left = mid;
      } else {
        // Key at "mid" is >= "target".  Therefore all blocks at or
        // after "mid" are uninteresting.
        right = mid - 1;
      }
    }

    // Linear search (within restart block) for first key >= target
    SeekToRestartPoint(left);
    while (true) {
      if (!ParseNextKey()) {
        return;
      }
      if (Compare(key_, target) >= 0) {
        return;
      }
    }
  }